

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int cmsysProcess_WaitForData(cmsysProcess *cp,char **data,int *length,double *userTimeout)

{
  fd_set *__readfds;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  __pid_t _Var4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  int *piVar8;
  char *pcVar9;
  __time_t _Var10;
  long lVar11;
  long lVar12;
  timeval *__timeout;
  long lVar13;
  int i;
  uint uVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  kwsysProcessTime kVar19;
  long local_98;
  double *local_90;
  kwsysProcessTime local_88;
  timeval local_40;
  
  if (cp == (cmsysProcess *)0x0) {
    return 0;
  }
  if (cp->State != 3) {
    return 0;
  }
  if (cp->Killed != 0) {
    return 0;
  }
  if (cp->TimeoutExpired != 0) {
    return 0;
  }
  if (userTimeout == (double *)0x0) {
    local_88 = (kwsysProcessTime)ZEXT816(0);
  }
  else {
    local_88 = kwsysProcessTimeGetCurrent();
  }
  dVar18 = cp->Timeout;
  lVar16 = (cp->TimeoutTime).tv_sec;
  if (lVar16 < 0 && 0.0 < dVar18) {
    lVar11 = (long)((dVar18 - (double)(long)dVar18) * 1000000.0);
    lVar15 = (cp->StartTime).tv_usec;
    lVar16 = lVar15 + lVar11;
    lVar15 = lVar15 + -1000000 + lVar11;
    if (lVar16 < 0xf4241) {
      lVar15 = lVar16;
    }
    lVar16 = (ulong)(1000000 < lVar16) + (long)dVar18 + (cp->StartTime).tv_sec;
    (cp->TimeoutTime).tv_sec = lVar16;
    (cp->TimeoutTime).tv_usec = lVar15;
  }
  lVar15 = (cp->TimeoutTime).tv_usec;
  if (userTimeout == (double *)0x0) {
LAB_003ea4ff:
    local_90 = (double *)0x0;
    bVar3 = false;
    lVar11 = lVar16;
    local_98 = lVar15;
  }
  else {
    kVar19 = kwsysProcessTimeGetCurrent();
    lVar12 = (long)*userTimeout;
    lVar13 = (long)((*userTimeout - (double)lVar12) * 1000000.0);
    lVar11 = kVar19.tv_usec + lVar13;
    local_98 = kVar19.tv_usec + -1000000 + lVar13;
    if (lVar11 < 0xf4241) {
      local_98 = lVar11;
    }
    lVar11 = (ulong)(1000000 < lVar11) + kVar19.tv_sec + lVar12;
    if (-1 < lVar16) {
      if ((lVar16 <= lVar11) && (lVar11 != lVar16 || lVar15 <= local_98)) goto LAB_003ea4ff;
    }
    bVar3 = true;
    local_90 = userTimeout;
  }
  __readfds = &cp->PipeSet;
  __timeout = &local_40;
  if (lVar11 < 0) {
    __timeout = (timeval *)0x0;
  }
LAB_003ea584:
  do {
    if (cp->PipesLeft < 1) {
      bVar2 = true;
      iVar5 = 0;
      goto LAB_003ea85f;
    }
    lVar16 = 0;
LAB_003ea593:
    if (lVar16 != 3) {
      uVar14 = cp->PipeReadEnds[lVar16];
      if (-1 < (int)uVar14) {
        if (((ulong)__readfds->__fds_bits[uVar14 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) != 0) {
          __readfds->__fds_bits[uVar14 >> 6] =
               __readfds->__fds_bits[uVar14 >> 6] & ~(1L << ((byte)uVar14 & 0x3f));
LAB_003ea5d9:
          sVar7 = read(cp->PipeReadEnds[lVar16],cp->PipeBuffer,0x400);
          if (sVar7 < 0) break;
          if (sVar7 == 0) goto LAB_003ea6bd;
          if (lVar16 == 2) {
            for (lVar15 = 0; lVar15 < cp->NumberOfCommands; lVar15 = lVar15 + 1) {
              if (cp->ForkPIDs[lVar15] != 0) {
                do {
                  _Var4 = waitpid(cp->ForkPIDs[lVar15],cp->CommandExitCodes + lVar15,1);
                  if (-1 < _Var4) {
                    if (_Var4 != 0) {
                      cp->ForkPIDs[lVar15] = 0;
                      piVar8 = &cp->CommandsLeft;
                      *piVar8 = *piVar8 + -1;
                      if (*piVar8 == 0) {
                        kwsysProcessCleanupDescriptor(&cp->SignalPipe);
                      }
                    }
                    goto LAB_003ea6b5;
                  }
                  piVar8 = __errno_location();
                } while (*piVar8 == 4);
                if (cp->State != 1) {
                  pcVar9 = strerror(*piVar8);
                  strncpy(cp->ErrorMessage,pcVar9,0x400);
                  cp->State = 1;
                }
              }
LAB_003ea6b5:
            }
            goto LAB_003ea6cb;
          }
          if (length == (int *)0x0 || data == (char **)0x0) goto LAB_003ea6cb;
          *data = cp->PipeBuffer;
          *length = (int)sVar7;
          bVar2 = true;
          if ((int)lVar16 == 1) {
            iVar5 = 3;
          }
          else if ((int)lVar16 == 0) {
            iVar5 = 2;
          }
          else {
            iVar5 = 0;
          }
          goto LAB_003ea85f;
        }
      }
      goto LAB_003ea6cb;
    }
    for (lVar16 = 0x90; lVar16 != 0xa0; lVar16 = lVar16 + 1) {
      (cp->PipeReadEnds + lVar16 * 2 + -3)[0] = 0;
      (cp->PipeReadEnds + lVar16 * 2 + -3)[1] = 0;
    }
    _Var10 = local_40.tv_sec;
    lVar16 = local_40.tv_usec;
    if (-1 < lVar11) {
      kVar19 = kwsysProcessTimeGetCurrent();
      lVar15 = local_98 - kVar19.tv_usec;
      _Var10 = (lVar15 >> 0x3f) + (lVar11 - kVar19.tv_sec);
      if ((local_90 == (double *)0x0) || (-1 < _Var10)) {
        lVar16 = lVar15 + 1000000;
        if (-1 < lVar15) {
          lVar16 = lVar15;
        }
        if (_Var10 < 0) goto LAB_003ea803;
      }
      else {
        if (0.0 < *local_90) {
LAB_003ea803:
          iVar5 = 0;
          bVar2 = false;
LAB_003ea85f:
          if (userTimeout != (double *)0x0) {
            kVar19 = kwsysProcessTimeGetCurrent();
            local_88.tv_usec = kVar19.tv_usec - local_88.tv_usec;
            lVar16 = local_88.tv_usec + 1000000;
            if (-1 < local_88.tv_usec) {
              lVar16 = local_88.tv_usec;
            }
            dVar17 = *userTimeout -
                     ((double)lVar16 * 1e-06 +
                     (double)((local_88.tv_usec >> 0x3f) + (kVar19.tv_sec - local_88.tv_sec)));
            dVar18 = 0.0;
            if (0.0 <= dVar17) {
              dVar18 = dVar17;
            }
            *userTimeout = dVar18;
          }
          iVar6 = 0xff;
          if (iVar5 != 0 || bVar2) {
            iVar6 = iVar5;
          }
          if (!bVar3 && (iVar5 == 0 && !bVar2)) {
            cmsysProcess_Kill(cp);
            cp->Killed = 0;
            cp->TimeoutExpired = 1;
            iVar6 = 0;
          }
          return iVar6;
        }
        _Var10 = 0;
        lVar16 = 0;
      }
    }
    local_40.tv_usec = lVar16;
    local_40.tv_sec = _Var10;
    uVar14 = 0xffffffff;
    for (lVar16 = 3; lVar16 != 6; lVar16 = lVar16 + 1) {
      uVar1 = cp->PipeReadEnds[lVar16 + -3];
      if ((-1 < (int)uVar1) &&
         (__readfds->__fds_bits[uVar1 >> 6] =
               __readfds->__fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f),
         (int)uVar14 < (int)uVar1)) {
        uVar14 = uVar1;
      }
    }
    if ((int)uVar14 < 0) {
      bVar2 = true;
      iVar5 = 0;
      goto LAB_003ea85f;
    }
    do {
      iVar5 = select(uVar14 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,__timeout);
      if (-1 < iVar5) {
        if (iVar5 == 0) goto LAB_003ea803;
        goto LAB_003ea584;
      }
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    pcVar9 = strerror(*piVar8);
    strncpy(cp->ErrorMessage,pcVar9,0x400);
    cmsysProcess_Kill(cp);
    cp->Killed = 0;
    cp->SelectError = 1;
  } while( true );
  piVar8 = __errno_location();
  if (*piVar8 != 4) goto code_r0x003ea5fb;
  goto LAB_003ea5d9;
code_r0x003ea5fb:
  if (*piVar8 != 0xb) {
LAB_003ea6bd:
    kwsysProcessCleanupDescriptor(cp->PipeReadEnds + lVar16);
    cp->PipesLeft = cp->PipesLeft + -1;
  }
LAB_003ea6cb:
  lVar16 = lVar16 + 1;
  goto LAB_003ea593;
}

Assistant:

int kwsysProcess_WaitForData(kwsysProcess* cp, char** data, int* length,
                             double* userTimeout)
{
  kwsysProcessTime userStartTime = {0, 0};
  kwsysProcessWaitData wd =
    {
      0,
      kwsysProcess_Pipe_None,
      0,
      0,
      {0, 0}
    };
  wd.UserTimeout = userTimeout;
  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing || cp->Killed ||
     cp->TimeoutExpired)
    {
    return kwsysProcess_Pipe_None;
    }

  /* Record the time at which user timeout period starts.  */
  if(userTimeout)
    {
    userStartTime = kwsysProcessTimeGetCurrent();
    }

  /* Calculate the time at which a timeout will expire, and whether it
     is the user or process timeout.  */
  wd.User = kwsysProcessGetTimeoutTime(cp, userTimeout,
                                       &wd.TimeoutTime);

  /* Data can only be available when pipes are open.  If the process
     is not running, cp->PipesLeft will be 0.  */
  while(cp->PipesLeft > 0 &&
        !kwsysProcessWaitForPipe(cp, data, length, &wd)) {}

  /* Update the user timeout.  */
  if(userTimeout)
    {
    kwsysProcessTime userEndTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime difference = kwsysProcessTimeSubtract(userEndTime,
                                                           userStartTime);
    double d = kwsysProcessTimeToDouble(difference);
    *userTimeout -= d;
    if(*userTimeout < 0)
      {
      *userTimeout = 0;
      }
    }

  /* Check what happened.  */
  if(wd.PipeId)
    {
    /* Data are ready on a pipe.  */
    return wd.PipeId;
    }
  else if(wd.Expired)
    {
    /* A timeout has expired.  */
    if(wd.User)
      {
      /* The user timeout has expired.  It has no time left.  */
      return kwsysProcess_Pipe_Timeout;
      }
    else
      {
      /* The process timeout has expired.  Kill the children now.  */
      kwsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
      return kwsysProcess_Pipe_None;
      }
    }
  else
    {
    /* No pipes are left open.  */
    return kwsysProcess_Pipe_None;
    }
}